

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O0

LY_ERR lyd_new_implicit_all(lyd_node **tree,ly_ctx *ctx,uint32_t implicit_options,lyd_node **diff)

{
  ly_ctx *plVar1;
  lyd_node **local_90;
  ly_ctx *local_70;
  ly_ctx *local_68;
  ly_ctx *local_60;
  ly_ctx *local_58;
  ly_ctx *local_50;
  LY_ERR local_48;
  uint32_t local_44;
  LY_ERR rc;
  uint32_t i;
  lyd_node *d;
  lys_module *mod;
  lyd_node **diff_local;
  ly_ctx *plStack_20;
  uint32_t implicit_options_local;
  ly_ctx *ctx_local;
  lyd_node **tree_local;
  
  _rc = (lyd_node *)0x0;
  local_44 = 0;
  local_48 = LY_SUCCESS;
  mod = (lys_module *)diff;
  diff_local._4_4_ = implicit_options;
  plStack_20 = ctx;
  ctx_local = (ly_ctx *)tree;
  if (tree == (lyd_node **)0x0) {
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","tree","lyd_new_implicit_all");
    tree_local._4_4_ = LY_EINVAL;
  }
  else if ((*tree == (lyd_node *)0x0) && (ctx == (ly_ctx *)0x0)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","*tree || ctx",
           "lyd_new_implicit_all");
    tree_local._4_4_ = LY_EINVAL;
  }
  else {
    if (*tree != (lyd_node *)0x0) {
      if ((*tree)->schema == (lysc_node *)0x0) {
        plVar1 = (ly_ctx *)(*tree)[2].schema;
      }
      else {
        plVar1 = (*tree)->schema->module->ctx;
      }
      if ((plVar1 != (ly_ctx *)0x0) && (ctx != (ly_ctx *)0x0)) {
        if (*tree == (lyd_node *)0x0) {
          local_58 = (ly_ctx *)0x0;
        }
        else {
          if ((*tree)->schema == (lysc_node *)0x0) {
            local_50 = (ly_ctx *)(*tree)[2].schema;
          }
          else {
            local_50 = (*tree)->schema->module->ctx;
          }
          local_58 = local_50;
        }
        if (local_58 != ctx) {
          if (*tree == (lyd_node *)0x0) {
            local_68 = (ly_ctx *)0x0;
          }
          else {
            if ((*tree)->schema == (lysc_node *)0x0) {
              local_60 = (ly_ctx *)(*tree)[2].schema;
            }
            else {
              local_60 = (*tree)->schema->module->ctx;
            }
            local_68 = local_60;
          }
          ly_log(local_68,LY_LLERR,LY_EINVAL,"Different contexts mixed in a single function call.");
          return LY_EINVAL;
        }
      }
    }
    if (diff != (lyd_node **)0x0) {
      *diff = (lyd_node *)0x0;
    }
    if (ctx == (ly_ctx *)0x0) {
      if ((*tree)->schema == (lysc_node *)0x0) {
        local_70 = (ly_ctx *)(*tree)[2].schema;
      }
      else {
        local_70 = (*tree)->schema->module->ctx;
      }
      plStack_20 = local_70;
    }
    while (d = (lyd_node *)ly_ctx_get_module_iter(plStack_20,&local_44),
          (lys_module *)d != (lys_module *)0x0) {
      if (((lys_module *)d)->implemented != '\0') {
        if (mod == (lys_module *)0x0) {
          local_90 = (lyd_node **)0x0;
        }
        else {
          local_90 = (lyd_node **)&rc;
        }
        local_48 = lyd_new_implicit_module
                             ((lyd_node **)ctx_local,(lys_module *)d,diff_local._4_4_,local_90);
        if (local_48 != LY_SUCCESS) break;
        if (_rc != (lyd_node *)0x0) {
          lyd_insert_sibling((lyd_node *)mod->ctx,_rc,(lyd_node **)mod);
          _rc = (lyd_node *)0x0;
        }
      }
    }
    if ((local_48 != LY_SUCCESS) && (mod != (lys_module *)0x0)) {
      lyd_free_all((lyd_node *)mod->ctx);
      mod->ctx = (ly_ctx *)0x0;
    }
    tree_local._4_4_ = local_48;
  }
  return tree_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_implicit_all(struct lyd_node **tree, const struct ly_ctx *ctx, uint32_t implicit_options, struct lyd_node **diff)
{
    const struct lys_module *mod;
    struct lyd_node *d = NULL;
    uint32_t i = 0;
    LY_ERR rc = LY_SUCCESS;

    LY_CHECK_ARG_RET(ctx, tree, *tree || ctx, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(*tree ? LYD_CTX(*tree) : NULL, ctx, LY_EINVAL);
    if (diff) {
        *diff = NULL;
    }
    if (!ctx) {
        ctx = LYD_CTX(*tree);
    }

    /* add nodes for each module one-by-one */
    while ((mod = ly_ctx_get_module_iter(ctx, &i))) {
        if (!mod->implemented) {
            continue;
        }

        LY_CHECK_GOTO(rc = lyd_new_implicit_module(tree, mod, implicit_options, diff ? &d : NULL), cleanup);
        if (d) {
            /* merge into one diff */
            lyd_insert_sibling(*diff, d, diff);

            d = NULL;
        }
    }

cleanup:
    if (rc && diff) {
        lyd_free_all(*diff);
        *diff = NULL;
    }
    return rc;
}